

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

opj_bool opj_stream_read_seek
                   (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint local_4;
  
  in_RDI[7] = in_RDI[6];
  *(undefined4 *)(in_RDI + 10) = 0;
  iVar1 = (*(code *)in_RDI[5])(in_RSI,*in_RDI);
  if (iVar1 == 0) {
    *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) & 0xfffffffb;
    in_RDI[0xb] = in_RSI;
  }
  else {
    *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 4;
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

opj_bool opj_stream_read_seek (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_ARG_NOT_USED(p_event_mgr);
	p_stream->m_current_data = p_stream->m_stored_data;
	p_stream->m_bytes_in_buffer = 0;

	if( p_stream->m_seek_fn(p_size,p_stream->m_user_data)) {
		p_stream->m_status |= opj_stream_e_end;
		return EXIT_FAILURE;
	}
	else {
		// reset stream status
		p_stream->m_status &= (~opj_stream_e_end);
		p_stream->m_byte_offset = p_size;

	}

	return EXIT_SUCCESS;
}